

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BatchNorm_x86_fma::forward_inplace(BatchNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  undefined1 auVar13 [16];
  int iVar14;
  undefined1 (*pauVar15) [32];
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  
  iVar3 = bottom_top_blob->elempack;
  iVar22 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar5 = bottom_top_blob->h;
  iVar14 = bottom_top_blob->d;
  uVar6 = bottom_top_blob->c;
  if (iVar22 == 2) {
    iVar16 = iVar3 * iVar4;
    uVar18 = 0;
    uVar17 = 0;
    if (0 < (int)uVar5) {
      uVar17 = (ulong)uVar5;
    }
    for (; uVar18 != uVar17; uVar18 = uVar18 + 1) {
      pvVar8 = (this->super_BatchNorm).a_data.data;
      pvVar9 = (this->super_BatchNorm).b_data.data;
      uVar1 = *(uint *)((long)pvVar8 + uVar18 * 4);
      uVar2 = *(uint *)((long)pvVar9 + uVar18 * 4);
      auVar23 = ZEXT416(uVar1);
      if (iVar3 == 4) {
        auVar25 = *(undefined1 (*) [16])((long)pvVar8 + uVar18 * 0x10);
        auVar27._16_16_ = auVar25;
        auVar27._0_16_ = auVar25;
        auVar24 = *(undefined1 (*) [16])((long)pvVar9 + uVar18 * 0x10);
LAB_0013ec5a:
        auVar29._16_16_ = auVar24;
        auVar29._0_16_ = auVar24;
      }
      else {
        auVar25 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
        auVar24 = vshufps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0);
        if (iVar3 != 8) {
          auVar13 = vshufps_avx(auVar23,auVar23,0);
          auVar27._16_16_ = auVar13;
          auVar27._0_16_ = auVar13;
          goto LAB_0013ec5a;
        }
        auVar27 = *(undefined1 (*) [32])((long)pvVar8 + uVar18 * 0x20);
        auVar29 = *(undefined1 (*) [32])((long)pvVar9 + uVar18 * 0x20);
      }
      iVar7 = bottom_top_blob->w;
      pvVar8 = bottom_top_blob->data;
      sVar11 = bottom_top_blob->elemsize;
      pauVar15 = (undefined1 (*) [32])(uVar18 * (long)iVar7 * sVar11 + (long)pvVar8);
      lVar21 = 0;
      for (iVar19 = 0; iVar19 + 7 < iVar16; iVar19 = iVar19 + 8) {
        auVar13 = vfmadd132ps_fma(*pauVar15,auVar27,auVar29);
        *pauVar15 = ZEXT1632(auVar13);
        pauVar15 = pauVar15 + 1;
        lVar21 = lVar21 + 8;
      }
      for (; iVar19 + 3 < iVar16; iVar19 = iVar19 + 4) {
        auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar15,auVar25,auVar24);
        *(undefined1 (*) [16])*pauVar15 = auVar13;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        lVar21 = lVar21 + 4;
      }
      lVar20 = sVar11 * uVar18 * (long)iVar7;
      for (; (int)lVar21 < iVar16; lVar21 = lVar21 + 1) {
        auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar8 + lVar21 * 4 + lVar20)),auVar23,
                                  ZEXT416(uVar2));
        *(int *)((long)pvVar8 + lVar21 * 4 + lVar20) = auVar25._0_4_;
      }
    }
  }
  else if (iVar22 == 1) {
    pvVar8 = bottom_top_blob->data;
    pvVar9 = (this->super_BatchNorm).a_data.data;
    pvVar10 = (this->super_BatchNorm).b_data.data;
    iVar16 = iVar3 * iVar4;
    for (lVar21 = 0; (int)lVar21 + 7 < iVar16; lVar21 = lVar21 + 8) {
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar10 + lVar21 * 4),
                                *(undefined1 (*) [32])((long)pvVar8 + lVar21 * 4),
                                *(undefined1 (*) [32])((long)pvVar9 + lVar21 * 4));
      *(undefined1 (*) [32])((long)pvVar8 + lVar21 * 4) = ZEXT1632(auVar23);
    }
    for (; (int)lVar21 + 3 < iVar16; lVar21 = lVar21 + 4) {
      auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])((long)pvVar10 + lVar21 * 4),
                                *(undefined1 (*) [16])((long)pvVar8 + lVar21 * 4),
                                *(undefined1 (*) [16])((long)pvVar9 + lVar21 * 4));
      *(undefined1 (*) [16])((long)pvVar8 + lVar21 * 4) = auVar23;
    }
    for (; (int)lVar21 < iVar16; lVar21 = lVar21 + 1) {
      auVar23 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pvVar8 + lVar21 * 4)),
                                ZEXT416(*(uint *)((long)pvVar10 + lVar21 * 4)),
                                ZEXT416(*(uint *)((long)pvVar9 + lVar21 * 4)));
      *(int *)((long)pvVar8 + lVar21 * 4) = auVar23._0_4_;
    }
  }
  if (iVar22 - 3U < 2) {
    iVar14 = iVar4 * iVar3 * uVar5 * iVar14;
    uVar17 = 0;
    uVar18 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar18 = uVar17;
    }
    for (; uVar17 != uVar18; uVar17 = uVar17 + 1) {
      pvVar8 = (this->super_BatchNorm).a_data.data;
      pvVar9 = (this->super_BatchNorm).b_data.data;
      uVar5 = *(uint *)((long)pvVar8 + uVar17 * 4);
      uVar6 = *(uint *)((long)pvVar9 + uVar17 * 4);
      auVar23 = ZEXT416(uVar5);
      if (iVar3 == 4) {
        auVar25 = *(undefined1 (*) [16])((long)pvVar8 + uVar17 * 0x10);
        auVar26._16_16_ = auVar25;
        auVar26._0_16_ = auVar25;
        auVar24 = *(undefined1 (*) [16])((long)pvVar9 + uVar17 * 0x10);
LAB_0013eb2c:
        auVar28._16_16_ = auVar24;
        auVar28._0_16_ = auVar24;
      }
      else {
        auVar25 = vshufps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0);
        auVar24 = vshufps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0);
        if (iVar3 != 8) {
          auVar13 = vshufps_avx(auVar23,auVar23,0);
          auVar26._16_16_ = auVar13;
          auVar26._0_16_ = auVar13;
          goto LAB_0013eb2c;
        }
        auVar26 = *(undefined1 (*) [32])((long)pvVar8 + uVar17 * 0x20);
        auVar28 = *(undefined1 (*) [32])((long)pvVar9 + uVar17 * 0x20);
      }
      sVar11 = bottom_top_blob->cstep;
      pvVar8 = bottom_top_blob->data;
      sVar12 = bottom_top_blob->elemsize;
      pauVar15 = (undefined1 (*) [32])(sVar11 * uVar17 * sVar12 + (long)pvVar8);
      lVar21 = 0;
      for (iVar22 = 0; iVar22 + 7 < iVar14; iVar22 = iVar22 + 8) {
        auVar13 = vfmadd132ps_fma(*pauVar15,auVar26,auVar28);
        *pauVar15 = ZEXT1632(auVar13);
        pauVar15 = pauVar15 + 1;
        lVar21 = lVar21 + 8;
      }
      for (; iVar22 + 3 < iVar14; iVar22 = iVar22 + 4) {
        auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar15,auVar25,auVar24);
        *(undefined1 (*) [16])*pauVar15 = auVar13;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        lVar21 = lVar21 + 4;
      }
      lVar20 = sVar11 * sVar12 * uVar17;
      for (; (int)lVar21 < iVar14; lVar21 = lVar21 + 1) {
        auVar25 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)pvVar8 + lVar21 * 4 + lVar20)),auVar23,
                                  ZEXT416(uVar6));
        *(int *)((long)pvVar8 + lVar21 * 4 + lVar20) = auVar25._0_4_;
      }
    }
  }
  return 0;
}

Assistant:

int BatchNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}